

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NamedConditionalDirectiveExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedConditionalDirectiveExpressionSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Token name;
  NamedConditionalDirectiveExpressionSyntax *pNVar1;
  Info *in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pNVar1 = (NamedConditionalDirectiveExpressionSyntax *)
           allocate(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8);
  name.info = in_RSI;
  name._0_8_ = in_RSI->location;
  slang::syntax::NamedConditionalDirectiveExpressionSyntax::
  NamedConditionalDirectiveExpressionSyntax
            ((NamedConditionalDirectiveExpressionSyntax *)in_RSI->rawTextPtr,name);
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }